

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

int __thiscall
QHttpSocketEngine::bind(QHttpSocketEngine *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  QLatin1StringView latin1;
  undefined4 in_register_00000034;
  qsizetype qVar1;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff78;
  QString *errorString;
  SocketError error;
  QMessageLogger *in_stack_ffffffffffffff90;
  QString *this_00;
  QHttpSocketEngine *pQVar2;
  QString local_40;
  QString local_28;
  long local_8;
  
  qVar1 = CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  errorString = &local_28;
  pQVar2 = this;
  QMessageLogger::QMessageLogger
            (in_stack_ffffffffffffff90,(char *)this,(int)((ulong)errorString >> 0x20),
             (char *)(ulong)in_stack_ffffffffffffff78);
  QMessageLogger::warning((char *)errorString,"Operation is not supported");
  Qt::Literals::StringLiterals::operator____L1((char *)this,(size_t)errorString);
  error = (SocketError)((ulong)this >> 0x20);
  this_00 = &local_40;
  latin1.m_data = (char *)pQVar2;
  latin1.m_size = qVar1;
  QString::QString(this_00,latin1);
  QAbstractSocketEngine::setError((QAbstractSocketEngine *)this_00,error,errorString);
  QString::~QString((QString *)0x339799);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpSocketEngine::bind(const QHostAddress &, quint16)
{
    qWarning("Operation is not supported");
    setError(QAbstractSocket::UnsupportedSocketOperationError, "Unsupported socket operation"_L1);
    return false;
}